

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffchfl(fitsfile *fptr,int *status)

{
  long bytepos;
  long lVar1;
  bool bVar2;
  int iVar3;
  char *blanks;
  char rec [81];
  LONGLONG endpos;
  int local_28;
  int gotend;
  int i;
  int nblank;
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    bytepos = fptr->Fptr->headend;
    lVar1 = fptr->Fptr->datastart;
    ffmbyt(fptr,bytepos,1,status);
    bVar2 = false;
    for (local_28 = 0; local_28 < (int)((lVar1 - bytepos) / 0x50); local_28 = local_28 + 1) {
      ffgbyt(fptr,0x50,&blanks,status);
      iVar3 = strncmp((char *)&blanks,"END     ",8);
      if (iVar3 == 0) {
        if (bVar2) {
          *status = 0xfe;
          ffpmsg("Warning: Header fill area contains duplicate END card:");
        }
        bVar2 = true;
        iVar3 = strncmp(rec,
                        "                                                                        ",
                        0x48);
        if (iVar3 != 0) {
          *status = 0xfd;
          ffpmsg("Warning: END keyword contains extraneous non-blank characters:");
        }
      }
      else if ((bVar2) &&
              (iVar3 = strncmp((char *)&blanks,
                               "                                                                                "
                               ,0x50), iVar3 != 0)) {
        *status = 0xfe;
        ffpmsg("Warning: Header fill area contains extraneous non-blank characters:");
      }
      if (0 < *status) {
        rec[0x48] = '\0';
        ffpmsg((char *)&blanks);
        return *status;
      }
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffchfl( fitsfile *fptr, int *status)
{
   int nblank,i,gotend;
   LONGLONG endpos;
   char rec[FLEN_CARD];
   char *blanks="                                                                                ";  /*  80 spaces  */

   if( *status > 0 ) return (*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   calculate the number of blank keyword slots in the header  */

   endpos=(fptr->Fptr)->headend;
   nblank=(long) (((fptr->Fptr)->datastart-endpos)/80);

   /*   move the i/o pointer to the end of the header keywords   */

   ffmbyt(fptr,endpos,TRUE,status);

   /*   find the END card (there may be blank keywords perceeding it)   */

   gotend=FALSE;
   for(i=0;i<nblank;i++) {
      ffgbyt(fptr,80,rec,status);
      if( !strncmp(rec, "END     ", 8) ) {
         if( gotend ) {
            /*   There is a duplicate END record   */
            *status=BAD_HEADER_FILL;
            ffpmsg("Warning: Header fill area contains duplicate END card:");
         }
         gotend=TRUE;
         if( strncmp( rec+8, blanks+8, 72) ) {
            /*   END keyword has extra characters   */
            *status=END_JUNK;
            ffpmsg(
            "Warning: END keyword contains extraneous non-blank characters:");
         }
      } else if( gotend ) {
         if( strncmp( rec, blanks, 80 ) ) {
            /*   The fill area contains extraneous characters   */
            *status=BAD_HEADER_FILL;
            ffpmsg(
         "Warning: Header fill area contains extraneous non-blank characters:");
         }
      }

      if( *status > 0 ) {
         rec[FLEN_CARD - 1] = '\0';  /* make sure string is null terminated */
         ffpmsg(rec);
         return( *status );
      }
   }
   return( *status );
}